

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O2

void __thiscall OpenMD::NameFinder::loadNames(NameFinder *this)

{
  NameFinder *this_00;
  Molecule *this_01;
  pointer ppAVar1;
  pointer ppRVar2;
  pointer ppBVar3;
  pointer ppBVar4;
  pointer ppTVar5;
  pointer ppIVar6;
  Atom *pAVar7;
  RigidBody *pRVar8;
  Bond *pBVar9;
  Bend *pBVar10;
  Torsion *pTVar11;
  element_type *peVar12;
  Inversion *pIVar13;
  TreeNodePtr molNode;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms;
  TreeNodePtr atomNode_1;
  TreeNodePtr bondNode;
  string atomName;
  MoleculeIterator mi;
  TreeNodePtr atomNode;
  string molName;
  NameFinder local_1f0;
  undefined1 local_1c0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  string local_1a0 [32];
  undefined1 *local_180;
  undefined1 *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_158;
  vector<int,_std::allocator<int>_> *local_150;
  MoleculeIterator local_148;
  undefined1 local_140 [40];
  undefined1 local_118 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  undefined1 local_f8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  undefined1 local_d8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined1 local_b8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_98 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 local_78 [16];
  string local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_148._M_node = (_Base_ptr)0x0;
  std::make_shared<OpenMD::TreeNode>();
  local_140._32_8_ = &this->root_;
  std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_140._32_8_,
             (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
  peVar12 = (this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,&this->nObjects_);
  SelectionSet::resize(&peVar12->bs,(vector<int,_std::allocator<int>_> *)&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  SelectionSet::setAll
            (&((this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->bs);
  this_01 = SimInfo::beginMolecule(this->info_,&local_148);
  local_180 = local_140 + 8;
  local_170 = &local_1a8;
  local_150 = &local_1f0.nObjects_;
  this_00 = (NameFinder *)(local_1c0 + 0x10);
  local_178 = local_180;
  local_168 = local_170;
  local_160 = local_170;
  local_158 = local_170;
  while (this_01 != (Molecule *)0x0) {
    Molecule::getType_abi_cxx11_((string *)(local_78 + 0x10),this_01);
    std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_b8,
               (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_140._32_8_);
    createNode(&local_1f0,(TreeNodePtr *)this,(string *)local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
    OpenMDBitSet::setBitOn
              ((OpenMDBitSet *)
               &((local_1f0.info_)->randNumGen_).
                super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[0xc]._M_use_count,(long)this_01->globalIndex_);
    ppAVar1 = (this_01->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)this_01;
    if (ppAVar1 !=
        (this_01->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) goto LAB_00219417;
    pAVar7 = (Atom *)0x0;
    while (pAVar7 != (Atom *)0x0) {
      (*(pAVar7->super_StuntDouble)._vptr_StuntDouble[7])(local_1a0,pAVar7);
      std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x10),
                 (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)&local_1f0);
      createNode((NameFinder *)local_140,(TreeNodePtr *)this,(string *)(local_d8 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)
                 ((local_1f0.info_)->randNumGen_).
                 super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi,(long)(pAVar7->super_StuntDouble).globalIndex_);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)
                 (((RandNumGenPtr *)(local_140._0_8_ + 0x18))->
                 super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi,(long)(pAVar7->super_StuntDouble).globalIndex_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_140 + 8));
      std::__cxx11::string::~string(local_1a0);
      ppAVar1 = ppAVar1 + 1;
      pAVar7 = (Atom *)0x0;
      if (ppAVar1 !=
          (((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
           ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 0x10))->
          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00219417:
        pAVar7 = *ppAVar1;
      }
    }
    ppRVar2 = (((vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_> *)
               ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 0x88))->
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    if (ppRVar2 !=
        (((vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_> *)
         ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 0x88))->
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_002194e6;
    pRVar8 = (RigidBody *)0x0;
    while (pRVar8 != (RigidBody *)0x0) {
      (*(pRVar8->super_StuntDouble)._vptr_StuntDouble[7])(local_1a0,pRVar8);
      std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_d8,
                 (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)&local_1f0);
      createNode((NameFinder *)local_140,(TreeNodePtr *)this,(string *)local_d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)
                 ((local_1f0.info_)->randNumGen_).
                 super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi,(long)(pRVar8->super_StuntDouble).globalIndex_);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)
                 (((RandNumGenPtr *)(local_140._0_8_ + 0x18))->
                 super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi,(long)(pRVar8->super_StuntDouble).globalIndex_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_140 + 8));
      std::__cxx11::string::~string(local_1a0);
      ppRVar2 = ppRVar2 + 1;
      pRVar8 = (RigidBody *)0x0;
      if (ppRVar2 !=
          (((vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_> *)
           ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 0x88))->
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_002194e6:
        pRVar8 = *ppRVar2;
      }
    }
    ppBVar3 = (((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)
               ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 0x28))->
              super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppBVar3 !=
        (((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)
         ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 0x28))->
        super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0021963f;
    pBVar9 = (Bond *)0x0;
    while (pBVar9 != (Bond *)0x0) {
      (*(pBVar9->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[2])(local_1a0,pBVar9);
      std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 0x10),
                 (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)&local_1f0);
      createNode(this_00,(TreeNodePtr *)this,(string *)(local_f8 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)
                 &((local_1f0.info_)->randNumGen_).
                  super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[2]._M_use_count,
                 (long)(pBVar9->super_ShortRangeInteraction).globalIndex_);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)(*(long *)(local_1c0._16_8_ + 0x20) + 0x28),
                 (long)(pBVar9->super_ShortRangeInteraction).globalIndex_);
      (*(pBVar9->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[8])
                (&local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pBVar9);
      for (peVar12 = (element_type *)
                     local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          peVar12 !=
          local_1f0.root_.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar12 = (element_type *)&(peVar12->name)._M_string_length) {
        (**(code **)(*(long *)(peVar12->name)._M_dataplus._M_p + 0x38))((NameFinder *)local_140);
        std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_78,
                   (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this_00);
        createNode((NameFinder *)local_1c0,(TreeNodePtr *)this,(string *)local_78);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
        OpenMDBitSet::setBitOn
                  ((OpenMDBitSet *)
                   (((RandNumGenPtr *)(local_1c0._0_8_ + 0x18))->
                   super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(long)*(int *)((peVar12->name)._M_dataplus._M_p + 0x28));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c0 + 8));
        std::__cxx11::string::~string((string *)local_140);
      }
      std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
                ((_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                 &local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8);
      std::__cxx11::string::~string(local_1a0);
      ppBVar3 = ppBVar3 + 1;
      pBVar9 = (Bond *)0x0;
      if (ppBVar3 !=
          (((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)
           ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 0x28))->
          super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0021963f:
        pBVar9 = *ppBVar3;
      }
    }
    ppBVar4 = (((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)
               ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 0x40))->
              super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppBVar4 !=
        (((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)
         ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 0x40))->
        super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00219798;
    pBVar10 = (Bend *)0x0;
    while (pBVar10 != (Bend *)0x0) {
      (*(pBVar10->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[2])(local_1a0,pBVar10);
      std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_f8,
                 (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)&local_1f0);
      createNode(this_00,(TreeNodePtr *)this,(string *)local_f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)
                 (((local_1f0.info_)->randNumGen_).
                  super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 5),(long)(pBVar10->super_ShortRangeInteraction).globalIndex_);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)(*(long *)(local_1c0._16_8_ + 0x20) + 0x50),
                 (long)(pBVar10->super_ShortRangeInteraction).globalIndex_);
      (*(pBVar10->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[8])
                (&local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pBVar10);
      for (peVar12 = (element_type *)
                     local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          peVar12 !=
          local_1f0.root_.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar12 = (element_type *)&(peVar12->name)._M_string_length) {
        (**(code **)(*(long *)(peVar12->name)._M_dataplus._M_p + 0x38))((NameFinder *)local_140);
        std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(local_98 + 0x10),
                   (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this_00);
        createNode((NameFinder *)local_1c0,(TreeNodePtr *)this,(string *)(local_98 + 0x10));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
        OpenMDBitSet::setBitOn
                  ((OpenMDBitSet *)
                   (((RandNumGenPtr *)(local_1c0._0_8_ + 0x18))->
                   super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(long)*(int *)((peVar12->name)._M_dataplus._M_p + 0x28));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c0 + 8));
        std::__cxx11::string::~string((string *)local_140);
      }
      std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
                ((_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                 &local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8);
      std::__cxx11::string::~string(local_1a0);
      ppBVar4 = ppBVar4 + 1;
      pBVar10 = (Bend *)0x0;
      if (ppBVar4 !=
          (((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)
           ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 0x40))->
          super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00219798:
        pBVar10 = *ppBVar4;
      }
    }
    ppTVar5 = (((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
               ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 0x58))->
              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppTVar5 !=
        (((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
         ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 0x58))->
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_002198f1;
    pTVar11 = (Torsion *)0x0;
    while (pTVar11 != (Torsion *)0x0) {
      (*(pTVar11->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[2])(local_1a0,pTVar11);
      std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(local_118 + 0x10),
                 (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)&local_1f0);
      createNode(this_00,(TreeNodePtr *)this,(string *)(local_118 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)
                 &((local_1f0.info_)->randNumGen_).
                  super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[7]._M_use_count,
                 (long)(pTVar11->super_ShortRangeInteraction).globalIndex_);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)(*(long *)(local_1c0._16_8_ + 0x20) + 0x78),
                 (long)(pTVar11->super_ShortRangeInteraction).globalIndex_);
      (*(pTVar11->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[8])
                (&local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pTVar11);
      for (peVar12 = (element_type *)
                     local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          peVar12 !=
          local_1f0.root_.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar12 = (element_type *)&(peVar12->name)._M_string_length) {
        (**(code **)(*(long *)(peVar12->name)._M_dataplus._M_p + 0x38))((NameFinder *)local_140);
        std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_98,
                   (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this_00);
        createNode((NameFinder *)local_1c0,(TreeNodePtr *)this,(string *)local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
        OpenMDBitSet::setBitOn
                  ((OpenMDBitSet *)
                   (((RandNumGenPtr *)(local_1c0._0_8_ + 0x18))->
                   super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(long)*(int *)((peVar12->name)._M_dataplus._M_p + 0x28));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c0 + 8));
        std::__cxx11::string::~string((string *)local_140);
      }
      std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
                ((_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                 &local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8);
      std::__cxx11::string::~string(local_1a0);
      ppTVar5 = ppTVar5 + 1;
      pTVar11 = (Torsion *)0x0;
      if (ppTVar5 !=
          (((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
           ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 0x58))->
          super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_002198f1:
        pTVar11 = *ppTVar5;
      }
    }
    ppIVar6 = (((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
               ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 0x70))->
              super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    if (ppIVar6 !=
        (((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
         ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 0x70))->
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00219a4e;
    pIVar13 = (Inversion *)0x0;
    while (pIVar13 != (Inversion *)0x0) {
      (*(pIVar13->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[2])(local_1a0,pIVar13);
      std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_118,
                 (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)&local_1f0);
      createNode(this_00,(TreeNodePtr *)this,(string *)local_118);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)
                 (((local_1f0.info_)->randNumGen_).
                  super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 10),(long)(pIVar13->super_ShortRangeInteraction).globalIndex_)
      ;
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)(*(long *)(local_1c0._16_8_ + 0x20) + 0xa0),
                 (long)(pIVar13->super_ShortRangeInteraction).globalIndex_);
      (*(pIVar13->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[8])
                (&local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pIVar13);
      for (peVar12 = (element_type *)
                     local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          peVar12 !=
          local_1f0.root_.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar12 = (element_type *)&(peVar12->name)._M_string_length) {
        (**(code **)(*(long *)(peVar12->name)._M_dataplus._M_p + 0x38))((NameFinder *)local_140);
        std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 0x10),
                   (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this_00);
        createNode((NameFinder *)local_1c0,(TreeNodePtr *)this,(string *)(local_b8 + 0x10));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
        OpenMDBitSet::setBitOn
                  ((OpenMDBitSet *)
                   (((RandNumGenPtr *)(local_1c0._0_8_ + 0x18))->
                   super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(long)*(int *)((peVar12->name)._M_dataplus._M_p + 0x28));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c0 + 8));
        std::__cxx11::string::~string((string *)local_140);
      }
      std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
                ((_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                 &local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8);
      std::__cxx11::string::~string(local_1a0);
      ppIVar6 = ppIVar6 + 1;
      pIVar13 = (Inversion *)0x0;
      if (ppIVar6 !=
          (((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
           ((long)local_1f0.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 0x70))->
          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00219a4e:
        pIVar13 = *ppIVar6;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f0.nObjects_);
    std::__cxx11::string::~string((string *)(local_78 + 0x10));
    this_01 = SimInfo::nextMolecule(this->info_,&local_148);
  }
  return;
}

Assistant:

void NameFinder::loadNames() {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    root_ = std::make_shared<TreeNode>();
    root_->bs.resize(nObjects_);
    root_->bs.setAll();  //

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      std::string molName = mol->getType();
      TreeNodePtr molNode = createNode(root_, molName);
      molNode->bs.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        std::string atomName = atom->getType();
        TreeNodePtr atomNode = createNode(molNode, atomName);

        molNode->bs.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
        atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
      }

      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        std::string rbName = rb->getType();
        TreeNodePtr rbNode = createNode(molNode, rbName);

        molNode->bs.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
        rbNode->bs.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());

        // COMMENTED OUT because rigid bodies are IntegrableObjects
        // (e.g. they are independently mobile, so selecting their
        // member atoms will give some odd results if we are computing
        // degrees of freedom elsewhere.

        // //create nodes for atoms belong to this rigidbody
        // for(atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai))
        // {
        //   std::string rbAtomName = atom->getType();
        //   TreeNodePtr rbAtomNode = createNode(rbNode, rbAtomName);

        //   rbAtomNode->bs.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
        // }
      }

      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        std::string bondName = bond->getName();
        TreeNodePtr bondNode = createNode(molNode, bondName);

        molNode->bs.bitsets_[BOND].setBitOn(bond->getGlobalIndex());
        bondNode->bs.bitsets_[BOND].setBitOn(bond->getGlobalIndex());

        std::vector<Atom*> atoms = bond->getAtoms();
        std::vector<Atom*>::iterator ai;

        for (ai = atoms.begin(); ai != atoms.end(); ++ai) {
          std::string atomName = (*ai)->getType();
          TreeNodePtr atomNode = createNode(bondNode, atomName);
          atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn((*ai)->getGlobalIndex());
        }
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        std::string bendName = bend->getName();
        TreeNodePtr bendNode = createNode(molNode, bendName);

        molNode->bs.bitsets_[BEND].setBitOn(bend->getGlobalIndex());
        bendNode->bs.bitsets_[BEND].setBitOn(bend->getGlobalIndex());

        std::vector<Atom*> atoms = bend->getAtoms();
        std::vector<Atom*>::iterator ai;

        for (ai = atoms.begin(); ai != atoms.end(); ++ai) {
          std::string atomName = (*ai)->getType();
          TreeNodePtr atomNode = createNode(bendNode, atomName);
          atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn((*ai)->getGlobalIndex());
        }
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        std::string torsionName = torsion->getName();
        TreeNodePtr torsionNode = createNode(molNode, torsionName);

        molNode->bs.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());
        torsionNode->bs.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());

        std::vector<Atom*> atoms = torsion->getAtoms();
        std::vector<Atom*>::iterator ai;

        for (ai = atoms.begin(); ai != atoms.end(); ++ai) {
          std::string atomName = (*ai)->getType();
          TreeNodePtr atomNode = createNode(torsionNode, atomName);
          atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn((*ai)->getGlobalIndex());
        }
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        std::string inversionName = inversion->getName();
        TreeNodePtr inversionNode = createNode(molNode, inversionName);

        molNode->bs.bitsets_[INVERSION].setBitOn(inversion->getGlobalIndex());
        inversionNode->bs.bitsets_[INVERSION].setBitOn(
            inversion->getGlobalIndex());
        std::vector<Atom*> atoms = inversion->getAtoms();
        std::vector<Atom*>::iterator ai;

        for (ai = atoms.begin(); ai != atoms.end(); ++ai) {
          std::string atomName = (*ai)->getType();
          TreeNodePtr atomNode = createNode(inversionNode, atomName);
          atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn((*ai)->getGlobalIndex());
        }
      }
    }
  }